

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O3

void __thiscall
FIX::ThreadedSocketAcceptor::ThreadedSocketAcceptor
          (ThreadedSocketAcceptor *this,Application *application,MessageStoreFactory *factory,
          SessionSettings *settings,LogFactory *logFactory)

{
  _Rb_tree_header *p_Var1;
  
  Acceptor::Acceptor(&this->super_Acceptor,application,factory,settings,logFactory);
  (this->super_Acceptor)._vptr_Acceptor = (_func_int **)&PTR__ThreadedSocketAcceptor_001ec760;
  p_Var1 = &(this->m_sockets)._M_t._M_impl.super__Rb_tree_header;
  (this->m_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_sockets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_portToSessions)._M_t._M_impl.super__Rb_tree_header;
  (this->m_portToSessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_portToSessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_portToSessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_portToSessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_portToSessions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_socketToPort)._M_t._M_impl.super__Rb_tree_header;
  (this->m_socketToPort)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_socketToPort)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_socketToPort)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_socketToPort)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_socketToPort)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_threads)._M_t._M_impl.super__Rb_tree_header;
  (this->m_threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_threads)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_mutex).m_count = 0;
  (this->m_mutex).m_threadID = 0;
  pthread_mutex_init((pthread_mutex_t *)&this->m_mutex,(pthread_mutexattr_t *)0x0);
  socket_init();
  return;
}

Assistant:

ThreadedSocketAcceptor::ThreadedSocketAcceptor(
  Application& application,
  MessageStoreFactory& factory,
  const SessionSettings& settings,
  LogFactory& logFactory ) EXCEPT ( ConfigError )
: Acceptor( application, factory, settings, logFactory )
{
  socket_init();
}